

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O3

void __thiscall
Assimp::Collada::Animation::CollectChannelsRecursively
          (Animation *this,
          vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
          *channels)

{
  pointer ppAVar1;
  
  std::vector<Assimp::Collada::AnimationChannel,std::allocator<Assimp::Collada::AnimationChannel>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Assimp::Collada::AnimationChannel*,std::vector<Assimp::Collada::AnimationChannel,std::allocator<Assimp::Collada::AnimationChannel>>>>
            ((vector<Assimp::Collada::AnimationChannel,std::allocator<Assimp::Collada::AnimationChannel>>
              *)channels,
             (channels->
             super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (this->mChannels).
             super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->mChannels).
             super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  for (ppAVar1 = (this->mSubAnims).
                 super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppAVar1 !=
      (this->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppAVar1 = ppAVar1 + 1) {
    CollectChannelsRecursively(*ppAVar1,channels);
  }
  return;
}

Assistant:

void CollectChannelsRecursively(std::vector<AnimationChannel> &channels)
	{
		channels.insert(channels.end(), mChannels.begin(), mChannels.end());

		for (std::vector<Animation*>::iterator it = mSubAnims.begin(); it != mSubAnims.end(); ++it)
		{
			Animation *pAnim = (*it);

			pAnim->CollectChannelsRecursively(channels);
		}
	}